

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void * MAPMapPEFile(HANDLE hFile)

{
  int __fd;
  bool bVar1;
  int *piVar2;
  __off64_t _Var3;
  ssize_t sVar4;
  size_t sVar5;
  USHORT *__src;
  IMAGE_DOS_HEADER *addr;
  long in_FS_OFFSET;
  char *gapBase_1;
  char *imageEnd;
  char *gapBase;
  void *sectionBase;
  IMAGE_SECTION_HEADER *currentHeader;
  int prot;
  void *sectionData;
  IMAGE_SECTION_HEADER *pIStack_208;
  uint i;
  size_t prevSectionSizeInMemory;
  void *prevSectionBase;
  char *sectionHeaderEnd;
  IMAGE_DOS_HEADER *pIStack_1e8;
  uint numSections;
  IMAGE_SECTION_HEADER *firstSection;
  size_t headerSize;
  void *pForceRelocBase;
  char *envVar;
  SIZE_T virtualSize;
  SIZE_T preferredBase;
  IMAGE_NT_HEADERS ntHeader;
  IMAGE_DOS_HEADER dosHeader;
  int fd;
  bool forceRelocs;
  void *retval;
  IMAGE_DOS_HEADER *loadedHeader;
  void *loadedBase;
  CPalThread *pThread;
  CFileProcessLocalData *pLocalData;
  IDataLock *pLocalDataLock;
  IPalObject *pFileObject;
  undefined1 *puStack_28;
  PAL_ERROR palError;
  HANDLE hFile_local;
  char sectionName [9];
  
  sectionName._1_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  pFileObject._4_4_ = 0;
  pLocalDataLock = (IDataLock *)0x0;
  pLocalData = (CFileProcessLocalData *)0x0;
  pThread = (CPalThread *)0x0;
  puStack_28 = (undefined1 *)hFile;
  loadedBase = CorUnix::InternalGetCurrentThread();
  loadedHeader = (IMAGE_DOS_HEADER *)0x0;
  retval = (void *)0x0;
  bVar1 = false;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (puStack_28 == &DAT_ffffffffffffffff) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    pFileObject._4_4_ = 6;
  }
  else {
    pFileObject._4_4_ =
         (**(code **)(*CorUnix::g_pObjectManager + 0x28))
                   (CorUnix::g_pObjectManager,loadedBase,puStack_28,CorUnix::aotFile,0x80000000,
                    &pLocalDataLock);
    if (pFileObject._4_4_ == 0) {
      pFileObject._4_4_ =
           (*pLocalDataLock->_vptr_IDataLock[3])(pLocalDataLock,loadedBase,0,&pLocalData,&pThread);
      if (pFileObject._4_4_ == 0) {
        __fd = *(int *)&pThread->m_pNext;
        piVar2 = __errno_location();
        *piVar2 = 0;
        _Var3 = lseek64(__fd,0,0);
        if (_Var3 == 0) {
          sVar4 = read(__fd,ntHeader.OptionalHeader.DataDirectory + 0xf,0x40);
          if (sVar4 == 0x40) {
            _Var3 = lseek64(__fd,(long)(int)dosHeader.e_res2._12_4_,0);
            if ((int)dosHeader.e_res2._12_4_ == _Var3) {
              sVar4 = read(__fd,&preferredBase,0x108);
              if (sVar4 == 0x108) {
                if ((((short)ntHeader.OptionalHeader.DataDirectory[0xf].VirtualAddress == 0x5a4d) &&
                    ((int)preferredBase == 0x4550)) &&
                   ((short)ntHeader.FileHeader.NumberOfSymbols == 0x20b)) {
                  if (ntHeader.OptionalHeader.ImageBase._4_4_ < 0x1000) {
                    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                      abort();
                    }
                    pFileObject._4_4_ = 0x57;
                  }
                  else {
                    virtualSize._0_4_ = ntHeader.OptionalHeader.AddressOfEntryPoint;
                    virtualSize._4_4_ = ntHeader.OptionalHeader.BaseOfCode;
                    envVar = (char *)(ulong)(uint)ntHeader.OptionalHeader._48_4_;
                    if (((ntHeader.OptionalHeader._16_8_ == 0) || (envVar == (char *)0x0)) ||
                       (envVar + ntHeader.OptionalHeader._16_8_ <
                        (ulong)ntHeader.OptionalHeader._16_8_)) {
                      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                        abort();
                      }
                      pFileObject._4_4_ = 0x57;
                    }
                    else {
                      pForceRelocBase = getenv("PAL_ForceRelocs");
                      if ((((char *)pForceRelocBase != (char *)0x0) &&
                          (sVar5 = strlen((char *)pForceRelocBase), sVar5 != 0)) &&
                         (bVar1 = true, (PAL_InitializeChakraCoreCalled & 1U) == 0)) {
                        abort();
                      }
                      headerSize = 0;
                      if (bVar1) {
                        headerSize = (size_t)mmap64((void *)virtualSize,0x1000,0,0x30,-1,0);
                        if ((undefined1 *)headerSize == &DAT_ffffffffffffffff) {
                          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                            abort();
                          }
                          bVar1 = false;
                        }
                        else if ((virtualSize != headerSize) &&
                                ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
                          abort();
                        }
                      }
                      CorUnix::InternalEnterCriticalSection
                                ((CPalThread *)loadedBase,&mapping_critsec);
                      loadedHeader = (IMAGE_DOS_HEADER *)
                                     mmap64((void *)virtualSize,(size_t)envVar,0,0x22,-1,0);
                      if (loadedHeader == (IMAGE_DOS_HEADER *)&DAT_ffffffffffffffff) {
                        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                          abort();
                        }
                        piVar2 = __errno_location();
                        strerror(*piVar2);
                        pFileObject._4_4_ = FILEGetLastErrorFromErrno();
                        loadedHeader = (IMAGE_DOS_HEADER *)0x0;
                      }
                      else {
                        if (bVar1) {
                          if (loadedHeader == (IMAGE_DOS_HEADER *)virtualSize) {
                            fprintf(_stderr,"] %s %s:%d","MAPMapPEFile",
                                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
                                    ,0x980);
                            fprintf(_stderr,"Expression: ((SIZE_T)loadedBase) != preferredBase\n");
                          }
                          munmap((void *)headerSize,0x1000);
                        }
                        if (loadedHeader == (IMAGE_DOS_HEADER *)virtualSize) {
                          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                            abort();
                          }
                        }
                        else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                          abort();
                        }
                        firstSection = (IMAGE_SECTION_HEADER *)0x1000;
                        pFileObject._4_4_ =
                             MAPmmapAndRecord((IPalObject *)pLocalDataLock,loadedHeader,loadedHeader
                                              ,0x1000,1,0x12,__fd,0,&retval);
                        if (pFileObject._4_4_ == 0) {
                          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                            abort();
                          }
                          if ((IMAGE_DOS_HEADER *)retval != loadedHeader) {
                            fprintf(_stderr,"] %s %s:%d","MAPMapPEFile",
                                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
                                   );
                            fprintf(_stderr,"Expression: loadedHeader == loadedBase\n");
                          }
                          pIStack_1e8 = (IMAGE_DOS_HEADER *)
                                        ((long)retval +
                                        (long)(int)(uint)(ushort)ntHeader.FileHeader.
                                                                 PointerToSymbolTable +
                                        (long)*(int *)((long)retval + 0x3c) + 0x18);
                          sectionHeaderEnd._4_4_ = (uint)preferredBase._6_2_;
                          prevSectionBase =
                               pIStack_1e8->e_res + (ulong)sectionHeaderEnd._4_4_ * 0x14 + -0xe;
                          if (((pIStack_1e8 < loadedHeader) || (prevSectionBase < pIStack_1e8)) ||
                             ((IMAGE_DOS_HEADER *)(envVar + (long)(loadedHeader->e_res + -0xe)) <
                              prevSectionBase)) {
                            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                              abort();
                            }
                            pFileObject._4_4_ = 0x57;
                          }
                          else {
                            prevSectionSizeInMemory = (size_t)loadedHeader;
                            pIStack_208 = firstSection;
                            for (sectionData._4_4_ = 0; sectionData._4_4_ < sectionHeaderEnd._4_4_;
                                sectionData._4_4_ = sectionData._4_4_ + 1) {
                              currentHeader._4_4_ = 0;
                              __src = pIStack_1e8->e_res + (ulong)sectionData._4_4_ * 0x14 + -0xe;
                              addr = (IMAGE_DOS_HEADER *)
                                     ((long)loadedHeader->e_res +
                                     ((ulong)*(uint *)(__src + 6) - 0x1c));
                              if (((addr < loadedHeader) ||
                                  ((IMAGE_DOS_HEADER *)
                                   ((long)addr->e_res + ((ulong)*(uint *)(__src + 8) - 0x1c)) < addr
                                  )) || ((envVar + (long)(loadedHeader->e_res + -0xe) <
                                          (char *)((long)addr->e_res +
                                                  ((ulong)*(uint *)(__src + 8) - 0x1c)) ||
                                         (addr < (IMAGE_DOS_HEADER *)
                                                 (pIStack_208->Name + prevSectionSizeInMemory))))) {
                                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                                  abort();
                                }
                                pFileObject._4_4_ = 0x57;
                                goto LAB_003a9245;
                              }
                              if (*(uint *)(__src + 8) < *(uint *)(__src + 4)) {
                                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                                  abort();
                                }
                                pFileObject._4_4_ = 0x57;
                                goto LAB_003a9245;
                              }
                              if ((IMAGE_DOS_HEADER *)(pIStack_208->Name + prevSectionSizeInMemory)
                                  < addr) {
                                pFileObject._4_4_ =
                                     MAPRecordMapping((IPalObject *)pLocalDataLock,loadedHeader,
                                                      pIStack_208->Name + prevSectionSizeInMemory,
                                                      (long)addr -
                                                      (long)(pIStack_208->Name +
                                                            prevSectionSizeInMemory),0);
                                if (pFileObject._4_4_ != 0) {
                                  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                                    abort();
                                  }
                                  goto LAB_003a9245;
                                }
                                pFileObject._4_4_ = 0;
                              }
                              if ((*(uint *)(__src + 0x12) & 0x20000000) != 0) {
                                currentHeader._4_4_ = 4;
                              }
                              if ((*(uint *)(__src + 0x12) & 0x40000000) != 0) {
                                currentHeader._4_4_ = currentHeader._4_4_ | 1;
                              }
                              if ((*(uint *)(__src + 0x12) & 0x80000000) != 0) {
                                currentHeader._4_4_ = currentHeader._4_4_ | 2;
                              }
                              pFileObject._4_4_ =
                                   MAPmmapAndRecord((IPalObject *)pLocalDataLock,loadedHeader,addr,
                                                    (ulong)*(uint *)(__src + 8),currentHeader._4_4_,
                                                    0x12,__fd,(ulong)*(uint *)(__src + 10),
                                                    (LPVOID *)&stack0xfffffffffffffde8);
                              if (pFileObject._4_4_ != 0) {
                                if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                                  abort();
                                }
                                goto LAB_003a9245;
                              }
                              sectionName[0] = '\0';
                              memcpy((void *)((long)&hFile_local + 7),__src,8);
                              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                                abort();
                              }
                              pIStack_208 = (IMAGE_SECTION_HEADER *)
                                            (ulong)(*(int *)(__src + 8) + 0xfffU & 0xfffff000);
                              prevSectionSizeInMemory = (size_t)addr;
                            }
                            if ((pIStack_208->Name + prevSectionSizeInMemory <
                                 envVar + (long)(loadedHeader->e_res + -0xe)) &&
                               (pFileObject._4_4_ =
                                     MAPRecordMapping((IPalObject *)pLocalDataLock,loadedHeader,
                                                      pIStack_208->Name + prevSectionSizeInMemory,
                                                      (long)(envVar + (long)(loadedHeader->e_res +
                                                                            -0xe)) -
                                                      (long)(pIStack_208->Name +
                                                            prevSectionSizeInMemory),0),
                               pFileObject._4_4_ != 0)) {
                              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                                abort();
                              }
                            }
                            else {
                              pFileObject._4_4_ = 0;
                            }
                          }
                        }
                        else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                          abort();
                        }
                      }
LAB_003a9245:
                      CorUnix::InternalLeaveCriticalSection
                                ((CPalThread *)loadedBase,&mapping_critsec);
                    }
                  }
                }
                else {
                  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                    abort();
                  }
                  pFileObject._4_4_ = 0x57;
                }
              }
              else {
                pFileObject._4_4_ = FILEGetLastErrorFromErrno();
              }
            }
            else {
              pFileObject._4_4_ = FILEGetLastErrorFromErrno();
            }
          }
          else {
            pFileObject._4_4_ = FILEGetLastErrorFromErrno();
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
          }
        }
        else {
          pFileObject._4_4_ = FILEGetLastErrorFromErrno();
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
        }
      }
      else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
    else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,loadedBase,0);
  }
  if (pLocalDataLock != (IDataLock *)0x0) {
    (*pLocalDataLock->_vptr_IDataLock[8])(pLocalDataLock,loadedBase);
  }
  if (pFileObject._4_4_ == 0) {
    _fd = loadedHeader;
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  else {
    _fd = (IMAGE_DOS_HEADER *)0x0;
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    if (loadedHeader != (IMAGE_DOS_HEADER *)0x0) {
      MAPUnmapPEFile(loadedHeader);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != sectionName._1_8_) {
    __stack_chk_fail();
  }
  return _fd;
}

Assistant:

void * MAPMapPEFile(HANDLE hFile)
{
    PAL_ERROR palError = 0;
    IPalObject *pFileObject = NULL;
    IDataLock *pLocalDataLock = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    CPalThread *pThread = InternalGetCurrentThread();
    void * loadedBase = NULL;
    IMAGE_DOS_HEADER * loadedHeader = NULL;
    void * retval;
#if _DEBUG
    bool forceRelocs = false;
#endif

    ENTRY("MAPMapPEFile (hFile=%p)\n", hFile);

    //Step 0: Verify values, find internal pal data structures.
    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR_(LOADER)( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto done;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
            pThread,
            hFile,
            &aotFile,
            GENERIC_READ,
            &pFileObject
            );
    if (NO_ERROR != palError)
    {
        ERROR_(LOADER)( "ReferenceObjectByHandle failed\n" );
        goto done;
    }

    palError = pFileObject->GetProcessLocalData(
            pThread,
            ReadLock,
            &pLocalDataLock,
            reinterpret_cast<void**>(&pLocalData)
            );
    if (NO_ERROR != palError)
    {
        ERROR_(LOADER)( "GetProcessLocalData failed\n" );
        goto done;
    }

    int fd;
    fd = pLocalData->unix_fd;
    //Step 1: Read the PE headers and reserve enough space for the whole image somewhere.
    IMAGE_DOS_HEADER dosHeader;
    IMAGE_NT_HEADERS ntHeader;
    errno = 0;
    if (0 != lseek(fd, 0, SEEK_SET))
    {
        palError = FILEGetLastErrorFromErrno();
        ERROR_(LOADER)( "lseek failed\n" );
        goto done;
    }
    if (sizeof(dosHeader) != read(fd, &dosHeader, sizeof(dosHeader)))
    {
        palError = FILEGetLastErrorFromErrno();
        ERROR_(LOADER)( "reading dos header failed\n" );
        goto done;
    }
    if (dosHeader.e_lfanew != lseek(fd, dosHeader.e_lfanew, SEEK_SET))
    {
        palError = FILEGetLastErrorFromErrno();
        goto done;
    }
    if (sizeof(ntHeader) != read(fd, &ntHeader, sizeof(ntHeader)))
    {
        palError = FILEGetLastErrorFromErrno();
        goto done;
    }

    if ((VAL16(IMAGE_DOS_SIGNATURE) != VAL16(dosHeader.e_magic))
        || (VAL32(IMAGE_NT_SIGNATURE) != VAL32(ntHeader.Signature))
        || (VAL16(IMAGE_NT_OPTIONAL_HDR_MAGIC) != VAL16(ntHeader.OptionalHeader.Magic) ) )
    {
        ERROR_(LOADER)( "Magic number mismatch\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    //this code requires that the file alignment be the same as the page alignment
    if (ntHeader.OptionalHeader.FileAlignment < VIRTUAL_PAGE_SIZE)
    {
        ERROR_(LOADER)( "Optional header file alignment is bad\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    //This doesn't read the entire NT header (the optional header technically has a variable length.  But I
    //don't need more directories.

    //I now know how big the file is.  Reserve enough address space for the whole thing.  Try to get the
    //preferred base.  Create the intial mapping as "no access".  We'll use that for the guard pages in the
    //"holes" between sections.
    SIZE_T preferredBase, virtualSize;
    preferredBase = ntHeader.OptionalHeader.ImageBase;
    virtualSize = ntHeader.OptionalHeader.SizeOfImage;

    // Validate the image header
    if (   (preferredBase == 0)
        || (virtualSize == 0)
        || (preferredBase + virtualSize < preferredBase)    // Does the image overflow?
        )
    {
        ERROR_(LOADER)( "image is corrupt\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

#if _DEBUG
    char * envVar;
    envVar = getenv("PAL_ForceRelocs");
    if (envVar && strlen(envVar) > 0)
    {
        forceRelocs = true;
        TRACE_(LOADER)("Forcing rebase of image\n");
    }
    void * pForceRelocBase;
    pForceRelocBase = NULL;
    if (forceRelocs)
    {
        //if we're forcing relocs, create an anonymous mapping at the preferred base.  Only create the
        //mapping if we can create it at the specified address.
        pForceRelocBase = mmap( (void*)preferredBase, VIRTUAL_PAGE_SIZE, PROT_NONE, MAP_ANON|MAP_FIXED, -1, 0 );
        if (pForceRelocBase == MAP_FAILED)
        {
            TRACE_(LOADER)("Attempt to take preferred base of %p to force relocation failed\n", (void*)preferredBase);
            forceRelocs = false;
        }
        else if ((void*)preferredBase != pForceRelocBase)
        {
            TRACE_(LOADER)("Attempt to take preferred base of %p to force relocation failed; actually got %p\n", (void*)preferredBase, pForceRelocBase);
        }
    }
#endif // _DEBUG

    // The first mmap mapping covers the entire file but just reserves space. Subsequent mappings cover
    // individual parts of the file, and actually map pages in. Note that according to the mmap() man page, "A
    // successful mmap deletes any previous mapping in the allocated address range." Also, "If a MAP_FIXED
    // request is successful, the mapping established by mmap() replaces any previous mappings for the process' pages
    // in the range from addr to addr + len." Thus, we will record a series of mappings here, one for the header
    // and each of the sections, as well as all the space between them that we give PROT_NONE protections.

    // We're going to start adding mappings to the mapping list, so take the critical section
    InternalEnterCriticalSection(pThread, &mapping_critsec);

#if !defined(_AMD64_)
    loadedBase = mmap((void*)preferredBase, virtualSize, PROT_NONE, MAP_ANON, -1, 0);
#else // defined(_AMD64_)    
    // MAC64 requires we pass MAP_SHARED (or MAP_PRIVATE) flags - otherwise, the call is failed. 
    // Refer to mmap documentation at http://www.manpagez.com/man/2/mmap/ for details.
    loadedBase = mmap((void*)preferredBase, virtualSize, PROT_NONE, MAP_ANON|MAP_PRIVATE, -1, 0);
#endif // !defined(_AMD64_)

    if (MAP_FAILED == loadedBase)
    {
        ERROR_(LOADER)( "mmap failed with code %d: %s.\n", errno, strerror( errno ) );
        palError = FILEGetLastErrorFromErrno();
        loadedBase = NULL; // clear it so we don't try to use it during clean-up
        goto doneReleaseMappingCriticalSection;
    }

    // All subsequent mappings of the PE file will be in the range [loadedBase, loadedBase + virtualSize)

#if _DEBUG
    if (forceRelocs)
    {
        _ASSERTE(((SIZE_T)loadedBase) != preferredBase);
        munmap(pForceRelocBase, VIRTUAL_PAGE_SIZE); // now that we've forced relocation, let the original address mapping go
    }
    if (((SIZE_T)loadedBase) != preferredBase)
    {
        TRACE_(LOADER)("Image rebased from preferredBase of %p to loadedBase of %p\n", preferredBase, loadedBase);
    }
    else
    {
        TRACE_(LOADER)("Image loaded at preferred base %p\n", loadedBase);
    }
#endif // _DEBUG

    //we have now reserved memory (potentially we got rebased).  Walk the PE sections and map each part
    //separately.

    size_t headerSize;
    headerSize = VIRTUAL_PAGE_SIZE; // if there are lots of sections, this could be wrong

    //first, map the PE header to the first page in the image.  Get pointers to the section headers
    palError = MAPmmapAndRecord(pFileObject, loadedBase,
                    loadedBase, headerSize, PROT_READ, MAP_FILE|MAP_PRIVATE|MAP_FIXED, fd, 0,
                    (void**)&loadedHeader);
    if (NO_ERROR != palError)
    {
        ERROR_(LOADER)( "mmap of PE header failed\n" );
        goto doneReleaseMappingCriticalSection;
    }

    TRACE_(LOADER)("PE header loaded @ %p\n", loadedHeader);
    _ASSERTE(loadedHeader == loadedBase); // we already preallocated the space, and we used MAP_FIXED, so we should have gotten this address
    IMAGE_SECTION_HEADER * firstSection;
    firstSection = (IMAGE_SECTION_HEADER*)(((char *)loadedHeader)
                                           + loadedHeader->e_lfanew
                                           + offsetof(IMAGE_NT_HEADERS, OptionalHeader)
                                           + VAL16(ntHeader.FileHeader.SizeOfOptionalHeader));
    unsigned numSections;
    numSections = ntHeader.FileHeader.NumberOfSections;

    // Validation
    char* sectionHeaderEnd;
    sectionHeaderEnd = (char*)firstSection + numSections * sizeof(IMAGE_SECTION_HEADER);
    if (   ((void*)firstSection < loadedBase)
        || ((char*)firstSection > sectionHeaderEnd)
        || (sectionHeaderEnd > (char*)loadedBase + virtualSize)
        )
    {
        ERROR_(LOADER)( "image is corrupt\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto doneReleaseMappingCriticalSection;
    }

    void* prevSectionBase;
    prevSectionBase = loadedBase; // the first "section" for our purposes is the header
    size_t prevSectionSizeInMemory;
    prevSectionSizeInMemory = headerSize;
    for (unsigned i = 0; i < numSections; ++i)
    {
        //for each section, map the section of the file to the correct virtual offset.  Gather the
        //protection bits from the PE file and convert them to the correct mmap PROT_* flags.
        void * sectionData;
        int prot = 0;
        IMAGE_SECTION_HEADER &currentHeader = firstSection[i];

        void* sectionBase = (char*)loadedBase + currentHeader.VirtualAddress;

        // Validate the section header
        if (   (sectionBase < loadedBase)                                                           // Did computing the section base overflow?
            || ((char*)sectionBase + currentHeader.SizeOfRawData < (char*)sectionBase)              // Does the section overflow?
            || ((char*)sectionBase + currentHeader.SizeOfRawData > (char*)loadedBase + virtualSize) // Does the section extend past the end of the image as the header stated?
            || ((char*)prevSectionBase + prevSectionSizeInMemory > sectionBase)                     // Does this section overlap the previous one?
            )
        {
            ERROR_(LOADER)( "section %d is corrupt\n", i );
            palError = ERROR_INVALID_PARAMETER;
            goto doneReleaseMappingCriticalSection;
        }
        if (currentHeader.Misc.VirtualSize > currentHeader.SizeOfRawData)
        {
            ERROR_(LOADER)( "no support for zero-padded sections, section %d\n", i );
            palError = ERROR_INVALID_PARAMETER;
            goto doneReleaseMappingCriticalSection;
        }

        // Is there space between the previous section and this one? If so, add a PROT_NONE mapping to cover it.
        if ((char*)prevSectionBase + prevSectionSizeInMemory < sectionBase)
        {
            char* gapBase = (char*)prevSectionBase + prevSectionSizeInMemory;
            palError = MAPRecordMapping(pFileObject,
                            loadedBase,
                            (void*)gapBase,
                            (char*)sectionBase - gapBase,
                            PROT_NONE);
            if (NO_ERROR != palError)
            {
                ERROR_(LOADER)( "recording gap section before section %d failed\n", i );
                goto doneReleaseMappingCriticalSection;
            }
        }

        //Don't discard these sections.  We need them to verify PE files
        //if (currentHeader.Characteristics & IMAGE_SCN_MEM_DISCARDABLE)
        //    continue;
        if (currentHeader.Characteristics & IMAGE_SCN_MEM_EXECUTE)
            prot |= PROT_EXEC;
        if (currentHeader.Characteristics & IMAGE_SCN_MEM_READ)
            prot |= PROT_READ;
        if (currentHeader.Characteristics & IMAGE_SCN_MEM_WRITE)
            prot |= PROT_WRITE;

        palError = MAPmmapAndRecord(pFileObject, loadedBase,
                        sectionBase,
                        currentHeader.SizeOfRawData,
                        prot,
                        MAP_FILE|MAP_PRIVATE|MAP_FIXED,
                        fd,
                        currentHeader.PointerToRawData,
                        &sectionData);
        if (NO_ERROR != palError)
        {
            ERROR_(LOADER)( "mmap of section %d failed\n", i );
            goto doneReleaseMappingCriticalSection;
        }

#if _DEBUG
        {
            // Ensure null termination of section name (which is allowed to not be null terminated if exactly 8 characters long)
            char sectionName[9];
            sectionName[8] = '\0';
            memcpy(sectionName, currentHeader.Name, sizeof(currentHeader.Name));
            TRACE_(LOADER)("Section %d '%s' (header @ %p) loaded @ %p (RVA: 0x%x, SizeOfRawData: 0x%x, PointerToRawData: 0x%x)\n",
                i, sectionName, &currentHeader, sectionData, currentHeader.VirtualAddress, currentHeader.SizeOfRawData, currentHeader.PointerToRawData);
        }
#endif // _DEBUG

        prevSectionBase = sectionBase;
        prevSectionSizeInMemory = (currentHeader.SizeOfRawData + VIRTUAL_PAGE_MASK) & ~VIRTUAL_PAGE_MASK; // round up to page boundary
    }

    // Is there space after the last section and before the end of the mapped image? If so, add a PROT_NONE mapping to cover it.
    char* imageEnd;
    imageEnd = (char*)loadedBase + virtualSize; // actually, points just after the mapped end
    if ((char*)prevSectionBase + prevSectionSizeInMemory < imageEnd)
    {
        char* gapBase = (char*)prevSectionBase + prevSectionSizeInMemory;
        palError = MAPRecordMapping(pFileObject,
                        loadedBase,
                        (void*)gapBase,
                        imageEnd - gapBase,
                        PROT_NONE);
        if (NO_ERROR != palError)
        {
            ERROR_(LOADER)( "recording end of image gap section failed\n" );
            goto doneReleaseMappingCriticalSection;
        }
    }

    palError = ERROR_SUCCESS;

doneReleaseMappingCriticalSection:

    InternalLeaveCriticalSection(pThread, &mapping_critsec);

done:

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    if (palError == ERROR_SUCCESS)
    {
        retval = loadedBase;
        LOGEXIT("MAPMapPEFile returns %p\n", retval);
    }
    else
    {
        retval = NULL;
        LOGEXIT("MAPMapPEFile error: %d\n", palError);

        // If we had an error, and had mapped anything, we need to unmap it
        if (loadedBase != NULL)
        {
            MAPUnmapPEFile(loadedBase);
        }
    }
    return retval;
}